

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

void __thiscall
DReachabilityPropagator::verificationDFS
          (DReachabilityPropagator *this,int r,vector<bool,_std::allocator<bool>_> *v)

{
  bool bVar1;
  iterator this_00;
  reference piVar2;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  GraphPropagator *in_RDI;
  reference rVar3;
  int e;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  reference local_58;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar4;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  reference local_30;
  vector<int,_std::allocator<int>_> *pvVar5;
  undefined4 in_stack_fffffffffffffff0;
  
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffffc0,
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffd8,true);
  local_30 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&in_RDI[3].es.data,(long)in_ESI);
  local_38._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff98);
  this_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_ffffffffffffff98), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_38);
    iVar4 = *piVar2;
    GraphPropagator::getEdgeVar(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    bVar1 = BoolView::isFixed((BoolView *)0x2b17bb);
    pvVar5 = in_RDX;
    if (bVar1) {
      GraphPropagator::getEdgeVar(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      bVar1 = BoolView::isFalse((BoolView *)in_RDI);
      pvVar5 = in_RDX;
      if (!bVar1) {
        GraphPropagator::getHead(in_RDI,(int)((ulong)in_RDX >> 0x20));
        local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)this_00._M_current,
                              CONCAT44(iVar4,in_stack_ffffffffffffffb8));
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_58);
        in_stack_ffffffffffffff98 = in_RDX;
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          GraphPropagator::getHead(in_RDI,(int)((ulong)in_RDX >> 0x20));
          verificationDFS((DReachabilityPropagator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          (int)((ulong)pvVar5 >> 0x20),
                          (vector<bool,_std::allocator<bool>_> *)rVar3._M_mask);
          in_stack_ffffffffffffff98 = in_RDX;
        }
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_38);
    in_RDX = pvVar5;
  }
  return;
}

Assistant:

void DReachabilityPropagator::verificationDFS(int r, std::vector<bool>& v) {
	v[r] = true;
	for (const int e : ou[r]) {
		if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isFalse()) {
			continue;
		}
		if (!v[getHead(e)]) {
			verificationDFS(getHead(e), v);
		}
	}
}